

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O3

void __thiscall
ritobin::io::text_write_impl::TextWriter::write<signed_char>(TextWriter *this,char value)

{
  __integer_to_chars_result_type<signed_char> _Var1;
  string result;
  char buffer [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char local_128 [256];
  
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  memset(local_128,0,0x100);
  _Var1 = std::__to_chars_i<signed_char>(local_128,&stack0xffffffffffffffd8,value,10);
  if (_Var1.ec == 0) {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_148,local_128,_Var1.ptr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_168,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)this->buffer_,
             *(undefined8 *)((vector<char,std::allocator<char>> *)this->buffer_ + 8),
             local_168._M_dataplus._M_p,local_168._M_dataplus._M_p + local_168._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            std::string result;
            from_num(result, value);
            buffer_.insert(buffer_.end(), result.begin(), result.end());
        }